

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_String.cc
# Opt level: O2

shared_ptr<QPDFObject> __thiscall QPDF_String::create_utf16(QPDF_String *this,string *utf8_val)

{
  bool bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<QPDFObject> sVar2;
  string result;
  string local_30;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  bVar1 = QUtil::utf8_to_pdf_doc(utf8_val,&result,'?');
  if (!bVar1) {
    QUtil::utf8_to_utf16(&local_30,utf8_val);
    std::__cxx11::string::operator=((string *)&result,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  QPDFObject::create<QPDF_String,std::__cxx11::string&>(&this->val);
  std::__cxx11::string::~string((string *)&result);
  sVar2.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar2.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObject>
QPDF_String::create_utf16(std::string const& utf8_val)
{
    std::string result;
    if (!QUtil::utf8_to_pdf_doc(utf8_val, result, '?')) {
        result = QUtil::utf8_to_utf16(utf8_val);
    }
    return QPDFObject::create<QPDF_String>(result);
}